

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O1

void * Abc_NtkBuildGlobalBdds
                 (Abc_Ntk_t *pNtk,int nBddSizeMax,int fDropInternal,int fReorder,int fReverse,
                 int fVerbose)

{
  long *plVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  DdManager *unique;
  int *piVar6;
  void *pvVar7;
  Abc_Obj_t *pAVar8;
  DdNode **ppDVar9;
  ulong uVar10;
  ProgressBar *pProgress;
  Vec_Ptr_t *pVVar11;
  DdNode *pDVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int Counter;
  int local_44;
  long local_40;
  DdNode *local_38;
  
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  if (7 < pNtk->vAttrs->nSize) {
    if (pNtk->vAttrs->pArray[7] != (void *)0x0) {
      __assert_fail("Abc_NtkGlobalBdd(pNtk) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0x148,"void *Abc_NtkBuildGlobalBdds(Abc_Ntk_t *, int, int, int, int, int)");
    }
    unique = Cudd_Init(pNtk->vCis->nSize,0,0x100,0x40000,0);
    iVar13 = pNtk->vObjs->nSize;
    piVar6 = (int *)malloc(0x30);
    iVar13 = iVar13 + 1;
    piVar6[4] = 0;
    piVar6[5] = 0;
    piVar6[6] = 0;
    piVar6[7] = 0;
    piVar6[8] = 0;
    piVar6[9] = 0;
    piVar6[10] = 0;
    piVar6[0xb] = 0;
    piVar6[0] = 0;
    piVar6[1] = 0;
    piVar6[2] = 0;
    piVar6[3] = 0;
    *(DdManager **)(piVar6 + 4) = unique;
    *(code **)(piVar6 + 6) = Extra_StopManager;
    piVar6[8] = 0;
    piVar6[9] = 0;
    iVar5 = 0x10;
    if (iVar13 != 0) {
      iVar5 = iVar13;
    }
    *(code **)(piVar6 + 10) = Cudd_RecursiveDeref;
    *piVar6 = iVar5;
    pvVar7 = malloc((long)iVar5 << 3);
    *(void **)(piVar6 + 2) = pvVar7;
    memset(pvVar7,0,(long)iVar5 << 3);
    if (pNtk->vAttrs->nSize < 8) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    pNtk->vAttrs->pArray[7] = piVar6;
    if (fReorder != 0) {
      Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    }
    pAVar8 = Abc_AigConst1(pNtk);
    if (0 < (pAVar8->vFanouts).nSize) {
      pVVar11 = pAVar8->pNtk->vAttrs;
      if (pVVar11->nSize < 8) goto LAB_002e4a98;
      piVar6 = (int *)pVVar11->pArray[7];
      if (*(void **)(piVar6 + 2) == (void *)0x0) {
LAB_002e4ad6:
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (*(long *)(piVar6 + 8) != 0) {
LAB_002e4ab7:
        __assert_fail("p->pFuncStartObj == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      pDVar12 = unique->one;
      iVar13 = pAVar8->Id;
      iVar5 = *piVar6;
      if (iVar5 <= iVar13) {
        iVar15 = iVar13 + 10;
        if (iVar13 < iVar5 * 2) {
          iVar15 = iVar5 * 2;
        }
        if (iVar5 < iVar15) {
          pvVar7 = realloc(*(void **)(piVar6 + 2),(long)iVar15 * 8);
          *(void **)(piVar6 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,((long)iVar15 - (long)*piVar6) * 8);
          *piVar6 = iVar15;
        }
      }
      *(DdNode **)(*(long *)(piVar6 + 2) + (long)iVar13 * 8) = pDVar12;
      Cudd_Ref(pDVar12);
    }
    pVVar11 = pNtk->vCis;
    uVar10 = (ulong)(uint)pVVar11->nSize;
    if (0 < pVVar11->nSize) {
      iVar13 = -1;
      lVar16 = 0;
      lVar14 = 0;
      do {
        plVar1 = *(long **)((long)pVVar11->pArray + lVar16);
        if (0 < *(int *)((long)plVar1 + 0x2c)) {
          if (fReverse == 0) {
            ppDVar9 = (DdNode **)((long)unique->vars + lVar16);
          }
          else {
            ppDVar9 = unique->vars + ((int)uVar10 + iVar13);
          }
          if (*(int *)(*(long *)(*plVar1 + 0x1b0) + 4) < 8) goto LAB_002e4a98;
          piVar6 = *(int **)(*(long *)(*(long *)(*plVar1 + 0x1b0) + 8) + 0x38);
          if (*(void **)(piVar6 + 2) == (void *)0x0) goto LAB_002e4ad6;
          if (*(long *)(piVar6 + 8) != 0) goto LAB_002e4ab7;
          pDVar12 = *ppDVar9;
          iVar5 = (int)plVar1[2];
          iVar15 = *piVar6;
          if (iVar15 <= iVar5) {
            iVar19 = iVar5 + 10;
            if (iVar5 < iVar15 * 2) {
              iVar19 = iVar15 * 2;
            }
            if (iVar15 < iVar19) {
              local_40 = (long)iVar19;
              local_38 = pDVar12;
              pvVar7 = realloc(*(void **)(piVar6 + 2),local_40 * 8);
              *(void **)(piVar6 + 2) = pvVar7;
              memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,(local_40 - *piVar6) * 8);
              *piVar6 = iVar19;
              pDVar12 = local_38;
            }
          }
          *(DdNode **)(*(long *)(piVar6 + 2) + (long)iVar5 * 8) = pDVar12;
          Cudd_Ref(pDVar12);
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pNtk->vCis;
        uVar10 = (ulong)pVVar11->nSize;
        iVar13 = iVar13 + -1;
        lVar16 = lVar16 + 8;
      } while (lVar14 < (long)uVar10);
    }
    local_44 = 0;
    pProgress = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[7]);
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        plVar1 = (long *)pVVar11->pArray[lVar14];
        pDVar12 = Abc_NodeGlobalBdds_rec
                            (unique,*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                     (long)*(int *)plVar1[4] * 8),nBddSizeMax,fDropInternal,
                             pProgress,&local_44,fVerbose);
        if (pDVar12 == (DdNode *)0x0) {
          if (fVerbose != 0) {
            puts("Constructing global BDDs is aborted.");
          }
          Abc_NtkAttrFree(pNtk,7,0);
          Cudd_Quit(unique);
          pVVar11 = pNtk->vObjs;
          iVar13 = pVVar11->nSize;
          lVar14 = (long)iVar13;
          if (0 < lVar14) {
            ppvVar2 = pVVar11->pArray;
            lVar16 = 0;
            do {
              pvVar7 = ppvVar2[lVar16];
              if ((((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xe) != 8)) &&
                  (uVar17 = *(uint *)((long)pvVar7 + 0x14) & 0xf, uVar17 != 4)) && (uVar17 != 10)) {
                *(undefined4 *)((long)pvVar7 + 0x2c) = 0;
              }
              lVar16 = lVar16 + 1;
            } while (lVar14 != lVar16);
          }
          if (0 < iVar13) {
            ppvVar2 = pVVar11->pArray;
            lVar16 = 0;
            do {
              plVar1 = (long *)ppvVar2[lVar16];
              if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xe) != 8)) &&
                 ((uVar17 = *(uint *)((long)plVar1 + 0x14) & 0xf, uVar17 != 5 &&
                  ((uVar17 != 10 && (iVar13 = *(int *)((long)plVar1 + 0x1c), 0 < (long)iVar13))))))
              {
                lVar3 = plVar1[4];
                lVar4 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
                lVar18 = 0;
                do {
                  piVar6 = (int *)(*(long *)(lVar4 + (long)*(int *)(lVar3 + lVar18 * 4) * 8) + 0x2c)
                  ;
                  *piVar6 = *piVar6 + 1;
                  lVar18 = lVar18 + 1;
                } while (iVar13 != lVar18);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != lVar14);
            return (void *)0x0;
          }
          return (void *)0x0;
        }
        pDVar12 = (DdNode *)((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^ (ulong)pDVar12);
        Cudd_Ref(pDVar12);
        if (*(int *)(*(long *)(*plVar1 + 0x1b0) + 4) < 8) goto LAB_002e4a98;
        piVar6 = *(int **)(*(long *)(*(long *)(*plVar1 + 0x1b0) + 8) + 0x38);
        if (*(void **)(piVar6 + 2) == (void *)0x0) goto LAB_002e4ad6;
        if (*(long *)(piVar6 + 8) != 0) goto LAB_002e4ab7;
        iVar13 = (int)plVar1[2];
        iVar5 = *piVar6;
        if (iVar5 <= iVar13) {
          iVar15 = iVar13 + 10;
          if (iVar13 < iVar5 * 2) {
            iVar15 = iVar5 * 2;
          }
          if (iVar5 < iVar15) {
            pvVar7 = realloc(*(void **)(piVar6 + 2),(long)iVar15 * 8);
            *(void **)(piVar6 + 2) = pvVar7;
            memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,((long)iVar15 - (long)*piVar6) * 8);
            *piVar6 = iVar15;
          }
        }
        *(DdNode **)(*(long *)(piVar6 + 2) + (long)iVar13 * 8) = pDVar12;
        lVar14 = lVar14 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar14 < pVVar11->nSize);
    }
    Extra_ProgressBarStop(pProgress);
    pVVar11 = pNtk->vObjs;
    iVar13 = pVVar11->nSize;
    lVar14 = (long)iVar13;
    if (0 < lVar14) {
      ppvVar2 = pVVar11->pArray;
      lVar16 = 0;
      do {
        pvVar7 = ppvVar2[lVar16];
        if ((((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xe) != 8)) &&
            (uVar17 = *(uint *)((long)pvVar7 + 0x14) & 0xf, uVar17 != 4)) && (uVar17 != 10)) {
          *(undefined4 *)((long)pvVar7 + 0x2c) = 0;
        }
        lVar16 = lVar16 + 1;
      } while (lVar14 != lVar16);
    }
    if (0 < iVar13) {
      ppvVar2 = pVVar11->pArray;
      lVar16 = 0;
      do {
        plVar1 = (long *)ppvVar2[lVar16];
        if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xe) != 8)) &&
           ((uVar17 = *(uint *)((long)plVar1 + 0x14) & 0xf, uVar17 != 5 &&
            ((uVar17 != 10 && (iVar13 = *(int *)((long)plVar1 + 0x1c), 0 < (long)iVar13)))))) {
          lVar3 = plVar1[4];
          lVar4 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          lVar18 = 0;
          do {
            piVar6 = (int *)(*(long *)(lVar4 + (long)*(int *)(lVar3 + lVar18 * 4) * 8) + 0x2c);
            *piVar6 = *piVar6 + 1;
            lVar18 = lVar18 + 1;
          } while (iVar13 != lVar18);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar14);
    }
    if (fReorder != 0) {
      Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
      Cudd_AutodynDisable(unique);
    }
    return unique;
  }
LAB_002e4a98:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void * Abc_NtkBuildGlobalBdds( Abc_Ntk_t * pNtk, int nBddSizeMax, int fDropInternal, int fReorder, int fReverse, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Att_t * pAttMan;
    DdManager * dd;
    DdNode * bFunc;
    int i, k, Counter;

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );

    // start the manager
    assert( Abc_NtkGlobalBdd(pNtk) == NULL );
    dd = Cudd_Init( Abc_NtkCiNum(pNtk), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    pAttMan = Vec_AttAlloc( Abc_NtkObjNumMax(pNtk) + 1, dd, (void (*)(void*))Extra_StopManager, NULL, (void (*)(void*,void*))Cudd_RecursiveDeref );
    Vec_PtrWriteEntry( pNtk->vAttrs, VEC_ATTR_GLOBAL_BDD, pAttMan );

    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // assign the constant node BDD
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
    {
        bFunc = dd->one;
        Abc_ObjSetGlobalBdd( pObj, bFunc );   Cudd_Ref( bFunc );
    }
    // set the elementary variables
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
        {
            bFunc = fReverse ? dd->vars[Abc_NtkCiNum(pNtk) - 1 - i] : dd->vars[i];
            Abc_ObjSetGlobalBdd( pObj, bFunc );  Cudd_Ref( bFunc );
        }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        bFunc = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Abc_NtkFreeGlobalBdds( pNtk, 0 );
            Cudd_Quit( dd ); 

            // reset references
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
                    pObj->vFanouts.nSize = 0;
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                    Abc_ObjForEachFanin( pObj, pFanin, k )
                        pFanin->vFanouts.nSize++;
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, (int)Abc_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Abc_ObjSetGlobalBdd( pObj, bFunc );
    }
    Extra_ProgressBarStop( pProgress );

/*
    // derefence the intermediate BDDs
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( pObj->pCopy ) 
        {
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pCopy );
            pObj->pCopy = NULL;
        }
*/
/*
    // make sure all nodes are derefed
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->pCopy != NULL )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has BDD assigned\n", pObj->Id );
        if ( pObj->vFanouts.nSize > 0 )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has refs assigned\n", pObj->Id );
    }
*/
    // reset references
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
            pObj->vFanouts.nSize = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                pFanin->vFanouts.nSize++;

    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}